

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall
Js::Type::SetAreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties(Type *this,bool truth)

{
  TypeFlagMask e1;
  uint uVar1;
  ScriptContext *pSVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  undefined1 local_20 [23];
  bool truth_local;
  Type *this_local;
  
  local_20[0xf] = truth;
  unique0x1000010b = (RuntimeFunction *)this;
  if (truth) {
    pSVar2 = GetScriptContext(this);
    uVar1 = (*(pSVar2->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    if ((uVar1 & 1) == 0) {
      ::operator|=(&this->flags,
                   TypeFlagMask_AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties);
      Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator->(&this->javascriptLibrary);
      JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                ((JavascriptLibrary *)local_20);
      this_00 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                            *)local_20);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Register(this_00,this);
    }
  }
  else {
    e1 = ::operator~(TypeFlagMask_AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties);
    ::operator&=(&this->flags,e1);
  }
  return;
}

Assistant:

void Type::SetAreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties(const bool truth)
    {
        if (truth)
        {
            if (GetScriptContext()->IsClosed())
            {
                // The cache is disabled after the script context is closed, to avoid issues between being closed and being deleted,
                // where the cache of these types in JavascriptLibrary may be reclaimed at any point
                return;
            }

            flags |= TypeFlagMask_AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties;
            javascriptLibrary->GetTypesWithOnlyWritablePropertyProtoChainCache()->Register(this);
        }
        else
        {
            flags &= ~TypeFlagMask_AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties;
        }
    }